

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef
BinaryenSIMDTernary(BinaryenModuleRef module,BinaryenOp op,BinaryenExpressionRef a,
                   BinaryenExpressionRef b,BinaryenExpressionRef c)

{
  SIMDTernary *this;
  
  this = (SIMDTernary *)MixedArena::allocSpace(&module->allocator,0x30,8);
  *(undefined8 *)&(this->super_SpecificExpression<(wasm::Expression::Id)32>).super_Expression = 0;
  (this->super_SpecificExpression<(wasm::Expression::Id)32>).super_Expression.type.id = 0;
  *(undefined8 *)&this->op = 0;
  this->a = (Expression *)0x0;
  this->b = (Expression *)0x0;
  this->c = (Expression *)0x0;
  (this->super_SpecificExpression<(wasm::Expression::Id)32>).super_Expression._id = SIMDTernaryId;
  (this->super_SpecificExpression<(wasm::Expression::Id)32>).super_Expression.type.id = 0;
  this->op = op;
  this->a = a;
  this->b = b;
  this->c = c;
  wasm::SIMDTernary::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenSIMDTernary(BinaryenModuleRef module,
                                          BinaryenOp op,
                                          BinaryenExpressionRef a,
                                          BinaryenExpressionRef b,
                                          BinaryenExpressionRef c) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeSIMDTernary(
        SIMDTernaryOp(op), (Expression*)a, (Expression*)b, (Expression*)c));
}